

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O3

void __thiscall
cmGeneratorTarget::GetExtraSources
          (cmGeneratorTarget *this,
          vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *data,string *config)

{
  pointer *pppcVar1;
  iterator __position;
  KindedSources *pKVar2;
  pointer __args;
  
  pKVar2 = GetKindedSources(this,config);
  __args = (pKVar2->Sources).
           super__Vector_base<cmGeneratorTarget::SourceAndKind,_std::allocator<cmGeneratorTarget::SourceAndKind>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (__args != (pKVar2->Sources).
                super__Vector_base<cmGeneratorTarget::SourceAndKind,_std::allocator<cmGeneratorTarget::SourceAndKind>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      if (__args->Kind == SourceKindExtra) {
        __position._M_current =
             (data->super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>)
             ._M_impl.super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (data->super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>).
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<cmSourceFile_const*,std::allocator<cmSourceFile_const*>>::
          _M_realloc_insert<cmSourceFile_const*const&>
                    ((vector<cmSourceFile_const*,std::allocator<cmSourceFile_const*>> *)data,
                     __position,&__args->Source);
        }
        else {
          *__position._M_current = __args->Source;
          pppcVar1 = &(data->
                      super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                      )._M_impl.super__Vector_impl_data._M_finish;
          *pppcVar1 = *pppcVar1 + 1;
        }
      }
      __args = __args + 1;
    } while (__args != (pKVar2->Sources).
                       super__Vector_base<cmGeneratorTarget::SourceAndKind,_std::allocator<cmGeneratorTarget::SourceAndKind>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  return;
}

Assistant:

void cmGeneratorTarget::GetExtraSources(std::vector<cmSourceFile const*>& data,
                                        const std::string& config) const
{
  IMPLEMENT_VISIT(SourceKindExtra);
}